

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionShape.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionShapeRectangular::UpdateProfile(ChBeamSectionShapeRectangular *this)

{
  pointer pvVar1;
  undefined8 *puVar2;
  undefined1 (*pauVar3) [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  std::
  vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
  ::resize(&this->ml_points,4);
  std::
  vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
  ::resize(&this->ml_normals,4);
  auVar5._0_8_ = this->y_thick;
  auVar5._8_8_ = this->z_thick;
  auVar6._8_8_ = 0x3fe0000000000000;
  auVar6._0_8_ = 0x3fe0000000000000;
  auVar5 = vmulpd_avx512vl(auVar5,auVar6);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            ((this->ml_points).
             super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,2);
  pvVar1 = (this->ml_points).
           super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar6 = vxorpd_avx512vl(auVar5,auVar4);
  puVar2 = *(undefined8 **)
            &(pvVar1->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data;
  *puVar2 = 0;
  *(undefined1 (*) [16])(puVar2 + 1) = auVar6;
  uVar7 = auVar6._8_8_;
  uVar8 = auVar5._0_8_;
  puVar2[3] = 0;
  puVar2[4] = uVar8;
  puVar2[5] = uVar7;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (pvVar1 + 1,2);
  pvVar1 = (this->ml_points).
           super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uStack_40 = auVar5._8_8_;
  puVar2 = *(undefined8 **)
            &pvVar1[1].
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data;
  *puVar2 = 0;
  puVar2[1] = uVar8;
  puVar2[2] = uVar7;
  puVar2[3] = 0;
  puVar2[4] = uVar8;
  puVar2[5] = uStack_40;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (pvVar1 + 2,2);
  pvVar1 = (this->ml_points).
           super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined8 **)
            &pvVar1[2].
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data;
  *puVar2 = 0;
  *(undefined1 (*) [16])(puVar2 + 1) = auVar5;
  local_38 = auVar6._0_8_;
  auVar5 = vmovlps_avx(auVar5,local_38);
  puVar2[3] = 0;
  *(undefined1 (*) [16])(puVar2 + 4) = auVar5;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (pvVar1 + 3,2);
  local_48 = auVar5._0_8_;
  uStack_40 = auVar5._8_8_;
  puVar2 = *(undefined8 **)
            &(this->ml_points).
             super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[3].
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data;
  *puVar2 = 0;
  puVar2[1] = local_48;
  puVar2[2] = uStack_40;
  puVar2[3] = 0;
  puVar2[4] = local_38;
  puVar2[5] = uVar7;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            ((this->ml_normals).
             super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,2);
  pvVar1 = (this->ml_normals).
           super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined8 **)
            &(pvVar1->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data;
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0xbff0000000000000;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0xbff0000000000000;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (pvVar1 + 1,2);
  pvVar1 = (this->ml_normals).
           super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar5 = vmovhps_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  pauVar3 = *(undefined1 (**) [16])
             &pvVar1[1].
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              ._M_impl.super__Vector_impl_data;
  *pauVar3 = auVar5;
  pauVar3[1] = ZEXT816(0) << 0x40;
  *(undefined8 *)pauVar3[2] = 0x3ff0000000000000;
  *(undefined8 *)(pauVar3[2] + 8) = 0;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (pvVar1 + 2,2);
  pvVar1 = (this->ml_normals).
           super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined8 **)
            &pvVar1[2].
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data;
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0x3ff0000000000000;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0x3ff0000000000000;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (pvVar1 + 3,2);
  auVar5 = vmovhps_avx(ZEXT816(0) << 0x40,0xbff0000000000000);
  pauVar3 = *(undefined1 (**) [16])
             &(this->ml_normals).
              super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              ._M_impl.super__Vector_impl_data;
  *pauVar3 = auVar5;
  pauVar3[1] = ZEXT816(0) << 0x40;
  *(undefined8 *)pauVar3[2] = 0xbff0000000000000;
  *(undefined8 *)(pauVar3[2] + 8) = 0;
  return;
}

Assistant:

void ChBeamSectionShapeRectangular::UpdateProfile() {
    ml_points.resize(4);
    ml_normals.resize(4);

    double y_thick_half = 0.5 * y_thick;
    double z_thick_half = 0.5 * z_thick;

    ml_points[0].resize(2);
    ml_points[0][0].Set(0, -y_thick_half, -z_thick_half);
    ml_points[0][1].Set(0, y_thick_half, -z_thick_half);

    ml_points[1].resize(2);
    ml_points[1][0].Set(0, y_thick_half, -z_thick_half);
    ml_points[1][1].Set(0, y_thick_half, z_thick_half);

    ml_points[2].resize(2);
    ml_points[2][0].Set(0, y_thick_half, z_thick_half);
    ml_points[2][1].Set(0, -y_thick_half, z_thick_half);

    ml_points[3].resize(2);
    ml_points[3][0].Set(0, -y_thick_half, z_thick_half);
    ml_points[3][1].Set(0, -y_thick_half, -z_thick_half);

    ml_normals[0].resize(2);
    ml_normals[0][0].Set(0, 0, -1);
    ml_normals[0][1].Set(0, 0, -1);

    ml_normals[1].resize(2);
    ml_normals[1][0].Set(0, 1, 0);
    ml_normals[1][1].Set(0, 1, 0);

    ml_normals[2].resize(2);
    ml_normals[2][0].Set(0, 0, 1);
    ml_normals[2][1].Set(0, 0, 1);

    ml_normals[3].resize(2);
    ml_normals[3][0].Set(0, -1, 0);
    ml_normals[3][1].Set(0, -1, 0);
}